

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O0

void h264e_dpb_build_list(H264eDpb *dpb,EncCpbStatus *cpb)

{
  H264eDpbFrm *pHVar1;
  H264eDpbFrm *pHVar2;
  uint uVar3;
  EncFrmStatus *in_stack_ffffffffffffff78;
  EncFrmStatus *frm_00;
  undefined8 uVar4;
  undefined4 uVar5;
  int local_70;
  undefined1 local_6c [8];
  H264eRplmo op;
  RK_S32 def_ref_frm_cnt;
  RK_S32 set_ref_frm_cnt;
  RK_S32 curr_frm_cnt;
  H264eDpbFrm *def_ref;
  H264eDpbFrm *refr;
  H264eDpbFrm *curr;
  H264eDpbFrm *p;
  EncFrmStatus *frm;
  RK_S32 lt_size;
  RK_S32 st_size;
  RK_S32 j;
  RK_S32 i;
  EncCpbStatus *cpb_local;
  H264eDpb *dpb_local;
  
  frm._4_4_ = 0;
  frm._0_4_ = 0;
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_build_list",dpb);
  }
  memset(dpb->list,0,0x80);
  if (((cpb->curr).val >> 4 & 1) == 0) {
    if ((h264e_debug & 0x200) != 0) {
      _mpp_log_l(4,"h264e_dpb","cpb init scaning start\n","h264e_dpb_build_list");
    }
    for (st_size = 0; uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20), st_size < 8;
        st_size = st_size + 1) {
      frm_00 = cpb->init + st_size;
      if ((frm_00->val & 1) != 0) {
        if ((frm_00->val >> 6 & 1) != 0) {
          in_stack_ffffffffffffff78 = (EncFrmStatus *)CONCAT44(uVar5,0xfc);
          _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!frm->is_non_ref",
                     "h264e_dpb_build_list",in_stack_ffffffffffffff78);
          if ((mpp_debug & 0x10000000) != 0) {
            abort();
          }
        }
        if ((h264e_debug & 0x200) != 0) {
          in_stack_ffffffffffffff78 =
               (EncFrmStatus *)
               (CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)frm_00->val) &
               0xffffffff00000001);
          _mpp_log_l(4,"h264e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                     "h264e_dpb_build_list",(ulong)(uint)st_size,frm_00->val >> 0x30,
                     in_stack_ffffffffffffff78,(uint)(frm_00->val >> 6) & 1,
                     (uint)(frm_00->val >> 7) & 1);
        }
        pHVar2 = find_cpb_frame(dpb,frm_00);
        if ((frm_00->val >> 7 & 1) == 0) {
          uVar3 = frm._4_4_ + 1;
          dpb->stref[(int)frm._4_4_] = pHVar2;
          (pHVar2->status).val = *(RK_U64 *)frm_00;
          frm._4_4_ = uVar3;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","found st %d st_size %d %p\n","h264e_dpb_build_list",
                       (ulong)(uint)st_size,(ulong)uVar3,frm_00);
            in_stack_ffffffffffffff78 = frm_00;
          }
        }
        else {
          uVar3 = (uint)frm + 1;
          dpb->ltref[(int)(uint)frm] = pHVar2;
          (pHVar2->status).val = *(RK_U64 *)frm_00;
          frm._0_4_ = uVar3;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","found lt %d lt_size %d %p\n","h264e_dpb_build_list",
                       (ulong)(uint)st_size,(ulong)uVar3,frm_00);
            in_stack_ffffffffffffff78 = frm_00;
          }
        }
      }
    }
    if ((h264e_debug & 0x200) != 0) {
      _mpp_log_l(4,"h264e_dpb","cpb init scaning done\n","h264e_dpb_build_list");
    }
    if ((h264e_debug & 0x100) != 0) {
      uVar4 = CONCAT44(uVar5,(uint)frm);
      _mpp_log_l(4,"h264e_dpb","dpb_size %d st_size %d lt_size %d\n","h264e_dpb_build_list",
                 (ulong)(uint)dpb->dpb_size,(ulong)frm._4_4_,uVar4);
      uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
    }
    if (1 < (int)frm._4_4_) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb st list before sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(dpb->stref,frm._4_4_);
      }
      qsort(dpb->stref,(long)(int)frm._4_4_,8,cmp_st_list);
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb st list after  sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(dpb->stref,frm._4_4_);
      }
    }
    if (1 < (int)(uint)frm) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb lt list before sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(dpb->ltref,(uint)frm);
      }
      qsort(dpb->ltref,(long)(int)(uint)frm,8,cmp_lt_list);
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb lt list after  sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(dpb->ltref,(uint)frm);
      }
    }
    memset(dpb->list,0,0x80);
    lt_size = 0;
    for (st_size = 0; st_size < (int)frm._4_4_; st_size = st_size + 1) {
      dpb->list[lt_size] = dpb->stref[st_size];
      lt_size = lt_size + 1;
    }
    for (st_size = 0; st_size < (int)(uint)frm; st_size = st_size + 1) {
      dpb->list[lt_size] = dpb->ltref[st_size];
      lt_size = lt_size + 1;
    }
    dpb->st_size = frm._4_4_;
    dpb->lt_size = (uint)frm;
    if (dpb->dpb_size < (int)(frm._4_4_ + (uint)frm)) {
      uVar4 = CONCAT44(uVar5,0x139);
      _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->dpb_size >= st_size + lt_size","h264e_dpb_build_list",uVar4);
      uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
      if ((mpp_debug & 0x10000000) != 0) {
        abort();
      }
    }
    if ((h264e_debug & 0x200) != 0) {
      h264e_dpb_dump_list(dpb);
    }
    h264e_reorder_wr_rewind(dpb->reorder);
    if (dpb->st_size + dpb->lt_size == 0) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","refer NULL\n","h264e_dpb_build_list");
      }
    }
    else {
      pHVar2 = dpb->curr;
      pHVar1 = dpb->refr;
      op.abs_diff_view_idx_minus1 = (RK_S32)(ushort)((pHVar1->status).val >> 0x30);
      op.long_term_pic_idx = (RK_S32)(ushort)((dpb->list[0]->status).val >> 0x30);
      if ((h264e_debug & 0x200) != 0) {
        uVar4 = CONCAT44(uVar5,op.abs_diff_view_idx_minus1);
        _mpp_log_l(4,"h264e_dpb","refer curr %d def %d set %d reorder %d\n","h264e_dpb_build_list",
                   (pHVar2->status).val >> 0x30,(ulong)(uint)op.long_term_pic_idx,uVar4,
                   (uint)(op.long_term_pic_idx != op.abs_diff_view_idx_minus1));
        uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
      }
      if (op.long_term_pic_idx != op.abs_diff_view_idx_minus1) {
        if ((h264e_debug & 0x200) != 0) {
          _mpp_log_l(4,"h264e_dpb","reorder to frm %d\n","h264e_dpb_build_list",
                     (pHVar1->status).val >> 0x30);
        }
        if (((pHVar1->status).val >> 6 & 1) != 0) {
          uVar4 = CONCAT44(uVar5,0x153);
          _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "!refr->status.is_non_ref","h264e_dpb_build_list",uVar4);
          uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
          if ((mpp_debug & 0x10000000) != 0) {
            abort();
          }
        }
        if (((pHVar1->status).val >> 7 & 1) == 0) {
          local_6c._0_4_ = ZEXT14(pHVar2->frame_num <= pHVar1->frame_num);
          if (pHVar2->frame_num - pHVar1->frame_num < 0) {
            local_70 = -(pHVar2->frame_num - pHVar1->frame_num);
          }
          else {
            local_70 = pHVar2->frame_num - pHVar1->frame_num;
          }
          local_6c._4_4_ = local_70 + -1;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","reorder st cur %d refr %d diff - 1 %d\n",
                       "h264e_dpb_build_list",(ulong)(uint)pHVar2->frame_num,
                       (ulong)(uint)pHVar1->frame_num,CONCAT44(uVar5,local_6c._4_4_));
          }
        }
        else {
          local_6c._0_4_ = 2;
          op.modification_of_pic_nums_idc = (uint)((pHVar1->status).val >> 8) & 0xf;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","reorder lt idx %d \n","h264e_dpb_build_list",
                       (ulong)(uint)op.modification_of_pic_nums_idc);
          }
        }
        h264e_reorder_wr_op(dpb->reorder,(H264eRplmo *)local_6c);
      }
    }
    if ((h264e_debug & 0x100) != 0) {
      _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_build_list",dpb);
    }
  }
  else if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_build_list",dpb);
  }
  return;
}

Assistant:

void h264e_dpb_build_list(H264eDpb *dpb, EncCpbStatus *cpb)
{
    RK_S32 i, j;
    RK_S32 st_size = 0;
    RK_S32 lt_size = 0;

    h264e_dbg_dpb("enter %p\n", dpb);

    /* clear list */
    memset(dpb->list, 0, sizeof(dpb->list));

    if (cpb->curr.is_intra) {
        h264e_dbg_dpb("leave %p\n", dpb);
        return ;
    }

    // 2.1 init list
    // 2.1.1 found all short term and long term ref
    h264e_dbg_list("cpb init scaning start\n");

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h264e_dbg_list("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                       i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        H264eDpbFrm *p = find_cpb_frame(dpb, frm);
        if (!frm->is_lt_ref) {
            dpb->stref[st_size++] = p;
            p->status.val = frm->val;
            h264e_dbg_list("found st %d st_size %d %p\n", i, st_size, frm);
        } else {
            dpb->ltref[lt_size++] = p;
            p->status.val = frm->val;
            h264e_dbg_list("found lt %d lt_size %d %p\n", i, lt_size, frm);
        }
    }

    h264e_dbg_list("cpb init scaning done\n");
    h264e_dbg_dpb("dpb_size %d st_size %d lt_size %d\n", dpb->dpb_size, st_size, lt_size);

    // sort st list
    if (st_size > 1) {
        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb st list before sort\n");
            h264e_dpb_dump_listX(dpb->stref, st_size);
        }

        qsort(dpb->stref, st_size, sizeof(dpb->stref[0]), cmp_st_list);

        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb st list after  sort\n");
            h264e_dpb_dump_listX(dpb->stref, st_size);
        }
    }

    if (lt_size > 1) {
        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb lt list before sort\n");
            h264e_dpb_dump_listX(dpb->ltref, lt_size);
        }

        qsort(dpb->ltref, lt_size, sizeof(dpb->ltref[0]), cmp_lt_list);

        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb lt list after  sort\n");
            h264e_dpb_dump_listX(dpb->ltref, lt_size);
        }
    }

    // generate list before reorder
    memset(dpb->list, 0, sizeof(dpb->list));
    j = 0;
    for (i = 0; i < st_size; i++)
        dpb->list[j++] = dpb->stref[i];

    for (i = 0; i < lt_size; i++)
        dpb->list[j++] = dpb->ltref[i];

    dpb->st_size = st_size;
    dpb->lt_size = lt_size;

    mpp_assert(dpb->dpb_size >= st_size + lt_size);

    if (h264e_debug & H264E_DBG_LIST)
        h264e_dpb_dump_list(dpb);

    /* generate syntax */
    h264e_reorder_wr_rewind(dpb->reorder);

    if (dpb->st_size + dpb->lt_size) {
        H264eDpbFrm *curr = dpb->curr;
        H264eDpbFrm *refr = dpb->refr;
        H264eDpbFrm *def_ref = dpb->list[0];

        RK_S32 curr_frm_cnt = curr->status.seq_idx;
        RK_S32 set_ref_frm_cnt = refr->status.seq_idx;
        RK_S32 def_ref_frm_cnt = def_ref->status.seq_idx;

        h264e_dbg_list("refer curr %d def %d set %d reorder %d\n",
                       curr_frm_cnt, def_ref_frm_cnt, set_ref_frm_cnt,
                       (def_ref_frm_cnt != set_ref_frm_cnt));

        if (def_ref_frm_cnt != set_ref_frm_cnt) {
            H264eRplmo op;

            h264e_dbg_list("reorder to frm %d\n", refr->status.seq_idx);

            mpp_assert(!refr->status.is_non_ref);

            op.modification_of_pic_nums_idc = (refr->status.is_lt_ref) ? (2) : (0);
            if (refr->status.is_lt_ref) {
                op.modification_of_pic_nums_idc = 2;
                op.long_term_pic_idx = refr->status.lt_idx;

                h264e_dbg_list("reorder lt idx %d \n", op.long_term_pic_idx);
            } else {
                op.modification_of_pic_nums_idc = curr->frame_num > refr->frame_num ? 0 : 1;
                op.abs_diff_pic_num_minus1 = MPP_ABS(curr->frame_num - refr->frame_num) - 1;

                h264e_dbg_list("reorder st cur %d refr %d diff - 1 %d\n",
                               curr->frame_num, refr->frame_num,
                               op.abs_diff_pic_num_minus1);
            }

            h264e_reorder_wr_op(dpb->reorder, &op);
        }
    } else {
        h264e_dbg_list("refer NULL\n");
    }

    h264e_dbg_dpb("leave %p\n", dpb);
}